

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_meshb(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_INT *pRVar1;
  REF_INT RVar2;
  REF_INT RVar3;
  REF_FILEPOS RVar4;
  uint uVar5;
  size_t sVar6;
  __off_t _Var7;
  void *pvVar8;
  size_t sVar9;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  double dStack_6e0;
  REF_INT new_geom;
  double double_gref;
  size_t sStack_6d0;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  uint local_670;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  uint local_638;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_INT cad_data_keyword;
  REF_DBL param [2];
  uint local_610;
  int local_60c;
  REF_INT ngeom;
  REF_INT geom;
  REF_INT i;
  REF_INT type;
  REF_INT geom_keyword;
  REF_INT node_per;
  REF_INT group;
  REF_INT id;
  REF_INT n4;
  REF_INT n3;
  REF_INT n2;
  REF_INT n1;
  REF_INT n0;
  REF_INT new_cell;
  REF_INT nodes [28];
  int local_560;
  uint local_55c;
  REF_INT cell;
  REF_INT ncell;
  REF_INT new_node;
  REF_INT node;
  REF_INT nnode;
  REF_INT keyword_code;
  REF_FILEPOS key_pos [156];
  REF_FILEPOS next_position;
  uint local_58;
  REF_BOOL available;
  REF_INT dim;
  REF_INT version;
  FILE *file;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_private_macro_code_rss_1 = 0;
  ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  ref_private_macro_code_rss_2 = ref_import_meshb_header(filename,&available,(REF_FILEPOS *)&nnode);
  if (ref_private_macro_code_rss_2 == 0) {
    if (ref_private_macro_code_rss_1 != 0) {
      printf("meshb version %d\n",(ulong)(uint)available);
    }
    local_638 = ref_grid_create((REF_GRID *)ref_mpi_local,(REF_MPI)filename_local);
    if (local_638 == 0) {
      ref_node = *(REF_NODE *)ref_mpi_local;
      ref_cell = *(REF_CELL *)&ref_node->blank;
      file = *(FILE **)&ref_node->ratio_method;
      if (ref_private_macro_code_rss_1 != 0) {
        printf("open %s\n",ref_grid);
      }
      _dim = fopen((char *)ref_grid,"r");
      if (_dim == (FILE *)0x0) {
        printf("unable to open %s\n",ref_grid);
      }
      if (_dim == (FILE *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x61e,"ref_import_meshb","unable to open file");
        ref_grid_ptr_local._4_4_ = 2;
      }
      else {
        ref_private_status_reis_ai._4_4_ =
             ref_import_meshb_jump
                       ((FILE *)_dim,available,(REF_FILEPOS *)&nnode,3,
                        (REF_BOOL *)((long)&next_position + 4),key_pos + 0x9b);
        if (ref_private_status_reis_ai._4_4_ == 0) {
          if (next_position._4_4_ == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x623,"ref_import_meshb","meshb missing dimension");
            ref_grid_ptr_local._4_4_ = 1;
          }
          else {
            ref_private_status_reis_bi = 1;
            _ref_private_macro_code_rss_4 = fread(&local_58,4,1,_dim);
            if (ref_private_status_reis_bi == _ref_private_macro_code_rss_4) {
              if (ref_private_macro_code_rss_1 != 0) {
                printf("meshb dim %d\n",(ulong)local_58);
              }
              if (((int)local_58 < 2) || (3 < (int)local_58)) {
                printf("dim %d not supported\n",(ulong)local_58);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x628,"ref_import_meshb","dim");
                ref_grid_ptr_local._4_4_ = 1;
              }
              else {
                if (local_58 == 2) {
                  *(undefined4 *)&ref_node[1].old_n_global = 1;
                }
                ref_private_macro_code_rss_5 =
                     ref_import_meshb_jump
                               ((FILE *)_dim,available,(REF_FILEPOS *)&nnode,4,
                                (REF_BOOL *)((long)&next_position + 4),key_pos + 0x9b);
                if (ref_private_macro_code_rss_5 == 0) {
                  if (next_position._4_4_ == 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x62f,"ref_import_meshb","meshb missing vertex");
                    ref_grid_ptr_local._4_4_ = 1;
                  }
                  else {
                    ref_private_macro_code_rss_6 =
                         ref_import_meshb_int((FILE *)_dim,available,&new_node);
                    if (ref_private_macro_code_rss_6 == 0) {
                      if (ref_private_macro_code_rss_1 != 0) {
                        printf("nnode %d\n",(ulong)(uint)new_node);
                      }
                      for (ncell = 0; ncell < new_node; ncell = ncell + 1) {
                        ref_private_macro_code_rss_7 =
                             ref_node_add((REF_NODE)ref_cell,(long)ncell,&cell);
                        if (ref_private_macro_code_rss_7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x634,"ref_import_meshb",(ulong)(uint)ref_private_macro_code_rss_7
                                 ,"add node");
                          return ref_private_macro_code_rss_7;
                        }
                        if (local_58 == 2) {
                          ref_private_macro_code_rss_8 =
                               meshb_real((FILE *)_dim,available,
                                          (REF_DBL *)(ref_cell->c2n + (long)(cell * 0xf) * 2));
                          if (ref_private_macro_code_rss_8 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x637,"ref_import_meshb",
                                   (ulong)(uint)ref_private_macro_code_rss_8,"x");
                            return ref_private_macro_code_rss_8;
                          }
                          ref_private_macro_code_rss_9 =
                               meshb_real((FILE *)_dim,available,
                                          (REF_DBL *)(ref_cell->c2n + (long)(cell * 0xf + 1) * 2));
                          if (ref_private_macro_code_rss_9 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x639,"ref_import_meshb",
                                   (ulong)(uint)ref_private_macro_code_rss_9,"y");
                            return ref_private_macro_code_rss_9;
                          }
                          pRVar1 = ref_cell->c2n;
                          (pRVar1 + (long)(cell * 0xf + 2) * 2)[0] = 0;
                          (pRVar1 + (long)(cell * 0xf + 2) * 2)[1] = 0;
                          ref_private_macro_code_rss_9 = 0;
                        }
                        else {
                          ref_private_macro_code_rss_10 =
                               meshb_real((FILE *)_dim,available,
                                          (REF_DBL *)(ref_cell->c2n + (long)(cell * 0xf) * 2));
                          if (ref_private_macro_code_rss_10 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x63d,"ref_import_meshb",
                                   (ulong)(uint)ref_private_macro_code_rss_10,"x");
                            return ref_private_macro_code_rss_10;
                          }
                          ref_private_macro_code_rss_11 =
                               meshb_real((FILE *)_dim,available,
                                          (REF_DBL *)(ref_cell->c2n + (long)(cell * 0xf + 1) * 2));
                          if (ref_private_macro_code_rss_11 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x63f,"ref_import_meshb",
                                   (ulong)(uint)ref_private_macro_code_rss_11,"y");
                            return ref_private_macro_code_rss_11;
                          }
                          local_670 = meshb_real((FILE *)_dim,available,
                                                 (REF_DBL *)
                                                 (ref_cell->c2n + (long)(cell * 0xf + 2) * 2));
                          if (local_670 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x641,"ref_import_meshb",(ulong)local_670,"z");
                            return local_670;
                          }
                          local_670 = 0;
                        }
                        ref_private_status_reis_ai_1._4_4_ =
                             ref_import_meshb_int((FILE *)_dim,available,&node_per);
                        if (ref_private_status_reis_ai_1._4_4_ != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x643,"ref_import_meshb",(ulong)ref_private_status_reis_ai_1._4_4_
                                 ,"nnode");
                          return ref_private_status_reis_ai_1._4_4_;
                        }
                        ref_private_status_reis_ai_1._4_4_ = 0;
                      }
                      ref_private_status_reis_bi_1 = key_pos[0x9b];
                      _ref_private_macro_code_rss_13 = ftello(_dim);
                      if (ref_private_status_reis_bi_1 == _ref_private_macro_code_rss_13) {
                        ref_private_macro_code_rss_14 =
                             ref_node_initialize_n_global((REF_NODE)ref_cell,(long)new_node);
                        if (ref_private_macro_code_rss_14 == 0) {
                          geom_keyword = 0;
                          ref_geom = (REF_GEOM)ref_node->global;
                          ref_private_macro_code_rss_14 = 0;
                          while (geom_keyword < 0x10) {
                            ref_private_macro_code_rss_15 =
                                 ref_cell_meshb_keyword((REF_CELL)ref_geom,&node);
                            if (ref_private_macro_code_rss_15 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                     ,0x64a,"ref_import_meshb",
                                     (ulong)(uint)ref_private_macro_code_rss_15,"kw");
                              return ref_private_macro_code_rss_15;
                            }
                            ref_private_macro_code_rss_16 =
                                 ref_import_meshb_jump
                                           ((FILE *)_dim,available,(REF_FILEPOS *)&nnode,node,
                                            (REF_BOOL *)((long)&next_position + 4),key_pos + 0x9b);
                            if (ref_private_macro_code_rss_16 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                     ,0x64d,"ref_import_meshb",
                                     (ulong)(uint)ref_private_macro_code_rss_16,"jump");
                              return ref_private_macro_code_rss_16;
                            }
                            if (next_position._4_4_ != 0) {
                              type = *(REF_INT *)&ref_geom->field_0xc;
                              ref_private_macro_code_rss_17 =
                                   ref_import_meshb_int
                                             ((FILE *)_dim,available,(REF_INT *)&local_55c);
                              if (ref_private_macro_code_rss_17 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x650,"ref_import_meshb",
                                       (ulong)(uint)ref_private_macro_code_rss_17,"ncell");
                                return ref_private_macro_code_rss_17;
                              }
                              if (ref_private_macro_code_rss_1 != 0) {
                                printf(" group %d ncell %d\n",(ulong)(uint)geom_keyword,
                                       (ulong)local_55c);
                              }
                              for (local_560 = 0; local_560 < (int)local_55c;
                                  local_560 = local_560 + 1) {
                                for (ncell = 0; ncell < type + 1; ncell = ncell + 1) {
                                  ref_private_status_reis_ai_2._4_4_ =
                                       ref_import_meshb_int((FILE *)_dim,available,&n0 + ncell);
                                  if (ref_private_status_reis_ai_2._4_4_ != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x654,"ref_import_meshb",
                                           (ulong)ref_private_status_reis_ai_2._4_4_,"c2n");
                                    return ref_private_status_reis_ai_2._4_4_;
                                  }
                                  ref_private_status_reis_ai_2._4_4_ = 0;
                                }
                                for (ncell = 0; RVar3 = nodes[2], RVar2 = nodes[1], ncell < type;
                                    ncell = ncell + 1) {
                                  (&n0)[ncell] = (&n0)[ncell] + -1;
                                }
                                if (ref_geom->n == 9) {
                                  n2 = n0;
                                  n3 = new_cell;
                                  n4 = nodes[0];
                                  id = nodes[1];
                                  group = nodes[2];
                                  nodes[1] = new_cell;
                                  nodes[2] = nodes[0];
                                  new_cell = RVar2;
                                  nodes[0] = RVar3;
                                }
                                ref_private_status_reis_ai_2._0_4_ =
                                     ref_cell_add((REF_CELL)ref_geom,&n0,&n1);
                                if ((uint)ref_private_status_reis_ai_2 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                         ,0x667,"ref_import_meshb",
                                         (ulong)(uint)ref_private_status_reis_ai_2,"add cell");
                                  return (uint)ref_private_status_reis_ai_2;
                                }
                                ref_private_status_reis_ai_2._0_4_ = 0;
                              }
                              ref_private_status_reis_bi_2 = key_pos[0x9b];
                              _ref_private_macro_code_rss_19 = ftell(_dim);
                              if (ref_private_status_reis_bi_2 != _ref_private_macro_code_rss_19) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x669,"ref_import_meshb","cell inconsistent",
                                       ref_private_status_reis_bi_2,_ref_private_macro_code_rss_19);
                                return 1;
                              }
                            }
                            geom_keyword = geom_keyword + 1;
                            ref_geom = (REF_GEOM)(&ref_node->global)[geom_keyword];
                          }
                          for (geom = 0; geom < 3; geom = geom + 1) {
                            i = geom + 0x28;
                            ref_private_macro_code_rss_20 =
                                 ref_import_meshb_jump
                                           ((FILE *)_dim,available,(REF_FILEPOS *)&nnode,i,
                                            (REF_BOOL *)((long)&next_position + 4),key_pos + 0x9b);
                            if (ref_private_macro_code_rss_20 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                     ,0x671,"ref_import_meshb",
                                     (ulong)(uint)ref_private_macro_code_rss_20,"jump");
                              return ref_private_macro_code_rss_20;
                            }
                            if (next_position._4_4_ != 0) {
                              ref_private_macro_code_rss_21 =
                                   ref_import_meshb_int
                                             ((FILE *)_dim,available,(REF_INT *)&local_610);
                              if (ref_private_macro_code_rss_21 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x673,"ref_import_meshb",
                                       (ulong)(uint)ref_private_macro_code_rss_21,"ngeom");
                                return ref_private_macro_code_rss_21;
                              }
                              if (ref_private_macro_code_rss_1 != 0) {
                                printf("type %d ngeom %d\n",(ulong)(uint)geom,(ulong)local_610);
                              }
                              for (local_60c = 0; RVar4 = key_pos[0x9b], local_60c < (int)local_610;
                                  local_60c = local_60c + 1) {
                                ref_private_status_reis_ai_3._4_4_ =
                                     ref_import_meshb_int((FILE *)_dim,available,&ncell);
                                if (ref_private_status_reis_ai_3._4_4_ != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                         ,0x677,"ref_import_meshb",
                                         (ulong)ref_private_status_reis_ai_3._4_4_,"node");
                                  return ref_private_status_reis_ai_3._4_4_;
                                }
                                ref_private_status_reis_ai_3._0_4_ =
                                     ref_import_meshb_int((FILE *)_dim,available,&node_per);
                                if ((uint)ref_private_status_reis_ai_3 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                         ,0x678,"ref_import_meshb",
                                         (ulong)(uint)ref_private_status_reis_ai_3,"node");
                                  return (uint)ref_private_status_reis_ai_3;
                                }
                                ref_private_status_reis_ai_3._0_4_ = 0;
                                for (ngeom = 0; ngeom < geom; ngeom = ngeom + 1) {
                                  ref_private_status_reis_bi_3 = 1;
                                  sStack_6d0 = fread(&verbose + (long)ngeom * 2,8,1,_dim);
                                  if (ref_private_status_reis_bi_3 != sStack_6d0) {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x67a,"ref_import_meshb","param",
                                           ref_private_status_reis_bi_3,sStack_6d0);
                                    return 1;
                                  }
                                }
                                ncell = ncell + -1;
                                double_gref._4_4_ =
                                     ref_geom_add((REF_GEOM)file,ncell,geom,node_per,
                                                  (REF_DBL *)&verbose);
                                if (double_gref._4_4_ != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                         ,0x67c,"ref_import_meshb",(ulong)double_gref._4_4_,
                                         "add geom");
                                  return double_gref._4_4_;
                                }
                                if (0 < geom) {
                                  sVar6 = fread(&stack0xfffffffffffff920,8,1,_dim);
                                  if (sVar6 != 1) {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x680,"ref_import_meshb","gref",1,sVar6);
                                    return 1;
                                  }
                                  uVar5 = ref_geom_find((REF_GEOM)file,ncell,geom,node_per,
                                                        (REF_INT *)
                                                        ((long)&ref_private_status_reis_ai_4 + 4));
                                  if (uVar5 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                           ,0x681,"ref_import_meshb",(ulong)uVar5,"find");
                                    return uVar5;
                                  }
                                  *(int *)(file->_IO_read_end +
                                          (long)(ref_private_status_reis_ai_4._4_4_ * 6 + 2) * 4) =
                                       (int)dStack_6e0;
                                }
                              }
                              _Var7 = ftello(_dim);
                              if (RVar4 != _Var7) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x685,"ref_import_meshb","end location",RVar4,_Var7);
                                return 1;
                              }
                            }
                          }
                          ref_private_macro_code_rss = 0x7e;
                          uVar5 = ref_import_meshb_jump
                                            ((FILE *)_dim,available,(REF_FILEPOS *)&nnode,0x7e,
                                             (REF_BOOL *)((long)&next_position + 4),key_pos + 0x9b);
                          if (uVar5 == 0) {
                            if (next_position._4_4_ != 0) {
                              uVar5 = ref_import_meshb_size
                                                ((FILE *)_dim,available,
                                                 (REF_SIZE *)(file->_unused2 + 4));
                              if (uVar5 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x690,"ref_import_meshb",(ulong)uVar5,"cad data size");
                                return uVar5;
                              }
                              if (ref_private_macro_code_rss_1 != 0) {
                                printf("cad_data %ld bytes\n",*(undefined8 *)(file->_unused2 + 4));
                              }
                              if (*(long *)(file->_unused2 + 0xc) != 0) {
                                free(*(void **)(file->_unused2 + 0xc));
                              }
                              pvVar8 = malloc(*(size_t *)(file->_unused2 + 4));
                              *(void **)(file->_unused2 + 0xc) = pvVar8;
                              if (*(long *)(file->_unused2 + 0xc) == 0) {
                                printf("%s: %d: %s: %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x696,"ref_import_meshb",
                                       "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL");
                                return 2;
                              }
                              sVar6 = *(size_t *)(file->_unused2 + 4);
                              sVar9 = fread(*(void **)(file->_unused2 + 0xc),1,
                                            *(size_t *)(file->_unused2 + 4),_dim);
                              if (sVar6 != sVar9) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x69a,"ref_import_meshb","cad_data",sVar6,sVar9);
                                return 1;
                              }
                              _Var7 = ftello(_dim);
                              if (key_pos[0x9b] != _Var7) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                       ,0x69b,"ref_import_meshb","end location",key_pos[0x9b],_Var7)
                                ;
                                return 1;
                              }
                            }
                            fclose(_dim);
                            ref_grid_ptr_local._4_4_ = 0;
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x68c,"ref_import_meshb",(ulong)uVar5,"jump");
                            ref_grid_ptr_local._4_4_ = uVar5;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x647,"ref_import_meshb",
                                 (ulong)(uint)ref_private_macro_code_rss_14,"init glob");
                          ref_grid_ptr_local._4_4_ = ref_private_macro_code_rss_14;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x645,"ref_import_meshb","end location",ref_private_status_reis_bi_1
                               ,_ref_private_macro_code_rss_13);
                        ref_grid_ptr_local._4_4_ = 1;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x630,"ref_import_meshb",(ulong)(uint)ref_private_macro_code_rss_6,
                             "nnode");
                      ref_grid_ptr_local._4_4_ = ref_private_macro_code_rss_6;
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x62e,"ref_import_meshb",(ulong)(uint)ref_private_macro_code_rss_5,"jump")
                  ;
                  ref_grid_ptr_local._4_4_ = ref_private_macro_code_rss_5;
                }
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x624,"ref_import_meshb","dim",ref_private_status_reis_bi,
                     _ref_private_macro_code_rss_4);
              ref_grid_ptr_local._4_4_ = 1;
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x622,"ref_import_meshb",(ulong)ref_private_status_reis_ai._4_4_,"jump");
          ref_grid_ptr_local._4_4_ = ref_private_status_reis_ai._4_4_;
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x616,"ref_import_meshb",(ulong)local_638,"create grid");
      ref_grid_ptr_local._4_4_ = local_638;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x613,
           "ref_import_meshb",(ulong)(uint)ref_private_macro_code_rss_2,"header");
    ref_grid_ptr_local._4_4_ = ref_private_macro_code_rss_2;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_meshb(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT keyword_code, nnode, node, new_node;
  REF_INT ncell, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER + 1]; /* everyone gets id in meshb */
  REF_INT new_cell;
  REF_INT n0, n1, n2, n3, n4, id, group, node_per;
  REF_INT geom_keyword, type, i, geom, ngeom;
  REF_DBL param[2];
  REF_INT cad_data_keyword;
  REF_BOOL verbose = REF_FALSE;

  if (verbose) printf("header %s\n", filename);
  RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
  if (verbose) printf("meshb version %d\n", version);

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);
  ref_geom = ref_grid_geom(ref_grid);

  if (verbose) printf("open %s\n", filename);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                            &next_position),
      "jump");
  RAS(available, "meshb missing dimension");
  REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
  if (verbose) printf("meshb dim %d\n", dim);
  if (dim < 2 || 3 < dim) {
    printf("dim %d not supported\n", dim);
    THROW("dim");
  }
  if (2 == dim) ref_grid_twod(ref_grid) = REF_TRUE;

  RSS(ref_import_meshb_jump(file, version, key_pos, 4, &available,
                            &next_position),
      "jump");
  RAS(available, "meshb missing vertex");
  RSS(ref_import_meshb_int(file, version, &nnode), "nnode");
  if (verbose) printf("nnode %d\n", nnode);

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    if (2 == dim) {
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 0, new_node))),
          "x");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 1, new_node))),
          "y");
      ref_node_xyz(ref_node, 2, new_node) = 0.0;
    } else {
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 0, new_node))),
          "x");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 1, new_node))),
          "y");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 2, new_node))),
          "z");
    }
    RSS(ref_import_meshb_int(file, version, &id), "nnode");
  }
  REIS(next_position, ftello(file), "end location");

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_meshb_keyword(ref_cell, &keyword_code), "kw");
    RSS(ref_import_meshb_jump(file, version, key_pos, keyword_code, &available,
                              &next_position),
        "jump");
    if (available) {
      node_per = ref_cell_node_per(ref_cell);
      RSS(ref_import_meshb_int(file, version, &ncell), "ncell");
      if (verbose) printf(" group %d ncell %d\n", group, ncell);
      for (cell = 0; cell < ncell; cell++) {
        for (node = 0; node < (1 + node_per); node++) {
          RSS(ref_import_meshb_int(file, version, &(nodes[node])), "c2n");
        }
        for (node = 0; node < node_per; node++) {
          nodes[node]--;
        }
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          nodes[0] = n0;
          nodes[3] = n1;
          nodes[4] = n2;
          nodes[1] = n3;
          nodes[2] = n4;
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add cell");
      }
      REIS(next_position, ftell(file), "cell inconsistent");
    }
  }

  each_ref_type(ref_geom, type) {
    geom_keyword = 40 + type;
    RSS(ref_import_meshb_jump(file, version, key_pos, geom_keyword, &available,
                              &next_position),
        "jump");
    if (available) {
      RSS(ref_import_meshb_int(file, version, &(ngeom)), "ngeom");
      if (verbose) printf("type %d ngeom %d\n", type, ngeom);

      for (geom = 0; geom < ngeom; geom++) {
        RSS(ref_import_meshb_int(file, version, &(node)), "node");
        RSS(ref_import_meshb_int(file, version, &(id)), "node");
        for (i = 0; i < type; i++)
          REIS(1, fread(&(param[i]), sizeof(double), 1, file), "param");
        node--;
        RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom");
        if (0 < type) {
          double double_gref;
          REF_INT new_geom;
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          RSS(ref_geom_find(ref_geom, node, type, id, &new_geom), "find");
          ref_geom_gref(ref_geom, new_geom) = (REF_INT)double_gref;
        }
      }
      REIS(next_position, ftello(file), "end location");
    }
  }

  cad_data_keyword = 126; /* GmfByteFlow */
  RSS(ref_import_meshb_jump(file, version, key_pos, cad_data_keyword,
                            &available, &next_position),
      "jump");
  if (available) {
    RSS(ref_import_meshb_size(file, version,
                              &(ref_geom_cad_data_size(ref_geom))),
        "cad data size");
    if (verbose)
      printf("cad_data %ld bytes\n", (long)ref_geom_cad_data_size(ref_geom));
    /* safe non-NULL free, if already allocated, to prevent memory leaks */
    ref_free(ref_geom_cad_data(ref_geom));
    ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                      ref_geom_cad_data_size(ref_geom), REF_BYTE);
    REIS(ref_geom_cad_data_size(ref_geom),
         fread(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
               ref_geom_cad_data_size(ref_geom), file),
         "cad_data");
    REIS(next_position, ftello(file), "end location");
  }

  fclose(file);

  return REF_SUCCESS;
}